

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::Matcher::Print
          (Matcher *this,DebugWriter *w,Char *input,CharCount inputLength,CharCount inputOffset,
          uint8 *instPointer,ContStack *contStack,AssertionStack *assertionStack)

{
  Char *str;
  code *pcVar1;
  bool bVar2;
  Label LVar3;
  Program *pPVar4;
  char16_t **ppcVar5;
  undefined4 *puVar6;
  GroupInfo **ppGVar7;
  LoopInfo **ppLVar8;
  uint local_360;
  uint local_35c;
  int i_1;
  int i;
  EndAssertionInst *actualInst_99;
  BeginAssertionInst *actualInst_98;
  TryMatchSetInst *actualInst_97;
  TryIfSetInst *actualInst_96;
  TryMatchCharInst *actualInst_95;
  TryIfCharInst *actualInst_94;
  TryInst *actualInst_93;
  ChompSetBoundedGroupLastCharInst *actualInst_92;
  ChompSetBoundedInst *actualInst_91;
  ChompCharBoundedInst *actualInst_90;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *actualInst_89;
  ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *actualInst_88;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *actualInst_87;
  ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *actualInst_86;
  ChompSetInst<(UnifiedRegex::ChompMode)1> *actualInst_85;
  ChompSetInst<(UnifiedRegex::ChompMode)0> *actualInst_84;
  ChompCharInst<(UnifiedRegex::ChompMode)1> *actualInst_83;
  ChompCharInst<(UnifiedRegex::ChompMode)0> *actualInst_82;
  RepeatGreedyLoopNoBacktrackInst *actualInst_81;
  BeginGreedyLoopNoBacktrackInst *actualInst_80;
  RepeatLoopFixedGroupLastIterationInst *actualInst_79;
  BeginLoopFixedGroupLastIterationInst *actualInst_78;
  LoopSetWithFollowFirstInst *actualInst_77;
  LoopSetInst *actualInst_76;
  RepeatLoopFixedInst *actualInst_75;
  BeginLoopFixedInst *actualInst_74;
  RepeatLoopIfSetInst *actualInst_73;
  RepeatLoopIfCharInst *actualInst_72;
  BeginLoopIfSetInst *actualInst_71;
  BeginLoopIfCharInst *actualInst_70;
  RepeatLoopInst *actualInst_69;
  BeginLoopInst *actualInst_68;
  DefineGroupFixedInst *actualInst_67;
  EndDefineGroupInst *actualInst_66;
  BeginDefineGroupInst *actualInst_65;
  MatchGroupInst *actualInst_64;
  SyncToLiteralsAndBackupInst *actualInst_63;
  SyncToLiteralEquivTrivialLastPatCharAndBackupInst *actualInst_62;
  SyncToLiteralEquivAndBackupInst *actualInst_61;
  SyncToLinearLiteralAndBackupInst *actualInst_60;
  SyncToLiteralAndBackupInst *actualInst_59;
  SyncToChar2LiteralAndBackupInst *actualInst_58;
  SyncToSetAndBackupInst<true> *actualInst_57;
  SyncToSetAndBackupInst<false> *actualInst_56;
  SyncToCharAndBackupInst *actualInst_55;
  SyncToLiteralEquivTrivialLastPatCharAndConsumeInst *actualInst_54;
  SyncToLiteralEquivAndConsumeInst *actualInst_53;
  SyncToLinearLiteralAndConsumeInst *actualInst_52;
  SyncToLiteralAndConsumeInst *actualInst_51;
  SyncToChar2LiteralAndConsumeInst *actualInst_50;
  SyncToSetAndConsumeInst<true> *actualInst_49;
  SyncToSetAndConsumeInst<false> *actualInst_48;
  SyncToChar2SetAndConsumeInst *actualInst_47;
  SyncToCharAndConsumeInst *actualInst_46;
  SyncToLiteralEquivTrivialLastPatCharAndContinueInst *actualInst_45;
  SyncToLiteralEquivAndContinueInst *actualInst_44;
  SyncToLinearLiteralAndContinueInst *actualInst_43;
  SyncToLiteralAndContinueInst *actualInst_42;
  SyncToChar2LiteralAndContinueInst *actualInst_41;
  SyncToSetAndContinueInst<true> *actualInst_40;
  SyncToSetAndContinueInst<false> *actualInst_39;
  SyncToChar2SetAndContinueInst *actualInst_38;
  SyncToCharAndContinueInst *actualInst_37;
  OptMatchSetInst *actualInst_36;
  OptMatchCharInst *actualInst_35;
  MatchTrieInst *actualInst_34;
  MatchLiteralEquivInst *actualInst_33;
  MatchLiteralInst *actualInst_32;
  MatchSetInst<true> *actualInst_31;
  MatchSetInst<false> *actualInst_30;
  MatchChar4Inst *actualInst_29;
  MatchChar3Inst *actualInst_28;
  MatchChar2Inst *actualInst_27;
  MatchCharInst *actualInst_26;
  WordBoundaryTestInst<false> *actualInst_25;
  WordBoundaryTestInst<true> *actualInst_24;
  EOLTestInst *actualInst_23;
  BOLTestInst *actualInst_22;
  EOITestInst<false> *actualInst_21;
  EOITestInst<true> *actualInst_20;
  BOITestInst<false> *actualInst_19;
  BOITestInst<true> *actualInst_18;
  SwitchAndConsume24Inst *actualInst_17;
  SwitchAndConsume16Inst *actualInst_16;
  SwitchAndConsume8Inst *actualInst_15;
  SwitchAndConsume4Inst *actualInst_14;
  SwitchAndConsume2Inst *actualInst_13;
  Switch24Inst *actualInst_12;
  Switch16Inst *actualInst_11;
  Switch8Inst *actualInst_10;
  Switch4Inst *actualInst_9;
  Switch2Inst *actualInst_8;
  MatchSetOrJumpInst *actualInst_7;
  JumpIfNotSetInst *actualInst_6;
  MatchCharOrJumpInst *actualInst_5;
  JumpIfNotCharInst *actualInst_4;
  JumpInst *actualInst_3;
  SuccInst *actualInst_2;
  FailInst *actualInst_1;
  NopInst *actualInst;
  Inst *inst;
  uint8 *instPointer_local;
  CharCount inputOffset_local;
  CharCount inputLength_local;
  Char *input_local;
  DebugWriter *w_local;
  Matcher *this_local;
  
  DebugWriter::PrintEOL(w,L"Matcher {");
  DebugWriter::Indent(w);
  DebugWriter::Print(w,L"program:      ");
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__((WriteBarrierPtr *)pPVar4);
  str = *ppcVar5;
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  DebugWriter::PrintQuotedString(w,str,pPVar4->sourceLen);
  DebugWriter::EOL(w);
  DebugWriter::Print(w,L"inputPointer: ");
  if (inputLength == 0) {
    DebugWriter::PrintEOL(w,L"<empty input>");
  }
  else if (inputLength < 0x401) {
    DebugWriter::PrintEscapedString(w,input,inputOffset);
    if (inputOffset < inputLength) {
      DebugWriter::Print(w,L"<<<");
      DebugWriter::PrintEscapedChar(w,input[inputOffset]);
      DebugWriter::Print(w,L">>>");
      DebugWriter::PrintEscapedString
                (w,input + (ulong)inputOffset + 1,(inputLength - inputOffset) - 1);
    }
    else {
      DebugWriter::Print(w,L"<<<>>>");
    }
    DebugWriter::EOL(w);
  }
  else {
    DebugWriter::PrintEOL(w,L"<string too large>");
  }
  pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
  if ((pPVar4->tag == BOIInstructionsTag) ||
     (pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program),
     pPVar4->tag == InstructionsTag)) {
    DebugWriter::Print(w,L"instPointer: ");
    switch(*instPointer) {
    case '\0':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      NopInst::Print((NopInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x01':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      FailInst::Print((FailInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x02':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SuccInst::Print((SuccInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x03':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      JumpInst::Print((JumpInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x04':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      JumpIfNotCharInst::Print((JumpIfNotCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x05':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchCharOrJumpInst::Print((MatchCharOrJumpInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x06':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      JumpIfNotSetInst::Print((JumpIfNotSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\a':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchSetOrJumpInst::Print((MatchSetOrJumpInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\b':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      Switch2Inst::Print((Switch2Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\t':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      Switch4Inst::Print((Switch4Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\n':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      Switch8Inst::Print((Switch8Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\v':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      Switch16Inst::Print((Switch16Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\f':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      Switch24Inst::Print((Switch24Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\r':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SwitchAndConsume2Inst::Print((SwitchAndConsume2Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x0e':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SwitchAndConsume4Inst::Print((SwitchAndConsume4Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x0f':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SwitchAndConsume8Inst::Print((SwitchAndConsume8Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x10':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SwitchAndConsume16Inst::Print((SwitchAndConsume16Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x11':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SwitchAndConsume24Inst::Print((SwitchAndConsume24Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x12':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BOITestInst<true>::Print((BOITestInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x13':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BOITestInst<false>::Print((BOITestInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x14':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      EOITestInst<true>::Print((EOITestInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x15':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      EOITestInst<false>::Print((EOITestInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x16':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BOLTestInst::Print((BOLTestInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x17':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      EOLTestInst::Print((EOLTestInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x18':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      WordBoundaryTestInst<true>::Print((WordBoundaryTestInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x19':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      WordBoundaryTestInst<false>::Print
                ((WordBoundaryTestInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x1a':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchCharInst::Print((MatchCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x1b':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchChar2Inst::Print((MatchChar2Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x1c':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchChar3Inst::Print((MatchChar3Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x1d':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchChar4Inst::Print((MatchChar4Inst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x1e':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchSetInst<false>::Print((MatchSetInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\x1f':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchSetInst<true>::Print((MatchSetInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case ' ':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchLiteralInst::Print((MatchLiteralInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '!':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchLiteralEquivInst::Print((MatchLiteralEquivInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\"':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchTrieInst::Print((MatchTrieInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '#':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      OptMatchCharInst::Print((OptMatchCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '$':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      OptMatchSetInst::Print((OptMatchSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '%':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToCharAndContinueInst::Print((SyncToCharAndContinueInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '&':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToChar2SetAndContinueInst::Print
                ((SyncToChar2SetAndContinueInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\'':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToSetAndContinueInst<false>::Print
                ((SyncToSetAndContinueInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '(':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToSetAndContinueInst<true>::Print
                ((SyncToSetAndContinueInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case ')':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                 instPointer,w,LVar3,*ppcVar5);
      break;
    case '*':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '+':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar3,*ppcVar5);
      break;
    case ',':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer
                 ,w,LVar3,*ppcVar5);
      break;
    case '-':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer
                 ,w,LVar3,*ppcVar5);
      break;
    case '.':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToCharAndConsumeInst::Print((SyncToCharAndConsumeInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '/':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToChar2SetAndConsumeInst::Print
                ((SyncToChar2SetAndConsumeInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '0':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToSetAndConsumeInst<false>::Print
                ((SyncToSetAndConsumeInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '1':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToSetAndConsumeInst<true>::Print
                ((SyncToSetAndConsumeInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '2':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *)instPointer
                 ,w,LVar3,*ppcVar5);
      break;
    case '3':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '4':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '5':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer,
                 w,LVar3,*ppcVar5);
      break;
    case '6':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer,
                 w,LVar3,*ppcVar5);
      break;
    case '7':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToCharAndBackupInst::Print((SyncToCharAndBackupInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '8':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToSetAndBackupInst<false>::Print
                ((SyncToSetAndBackupInst<false> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '9':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToSetAndBackupInst<true>::Print
                ((SyncToSetAndBackupInst<true> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case ':':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *)instPointer,
                 w,LVar3,*ppcVar5);
      break;
    case ';':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '<':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '=':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer,w
                 ,LVar3,*ppcVar5);
      break;
    case '>':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer,w
                 ,LVar3,*ppcVar5);
      break;
    case '?':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      SyncToLiteralsAndBackupInst::Print
                ((SyncToLiteralsAndBackupInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '@':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      MatchGroupInst::Print((MatchGroupInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'A':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginDefineGroupInst::Print((BeginDefineGroupInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'B':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      EndDefineGroupInst::Print((EndDefineGroupInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'C':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      DefineGroupFixedInst::Print((DefineGroupFixedInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'D':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginLoopInst::Print((BeginLoopInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'E':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      RepeatLoopInst::Print((RepeatLoopInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'F':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginLoopIfCharInst::Print((BeginLoopIfCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'G':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginLoopIfSetInst::Print((BeginLoopIfSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'H':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      RepeatLoopIfCharInst::Print((RepeatLoopIfCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'I':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      RepeatLoopIfSetInst::Print((RepeatLoopIfSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'J':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginLoopFixedInst::Print((BeginLoopFixedInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'K':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      RepeatLoopFixedInst::Print((RepeatLoopFixedInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'L':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      LoopSetInst::Print((LoopSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'M':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      LoopSetWithFollowFirstInst::Print((LoopSetWithFollowFirstInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'N':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginLoopFixedGroupLastIterationInst::Print
                ((BeginLoopFixedGroupLastIterationInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'O':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      RepeatLoopFixedGroupLastIterationInst::Print
                ((RepeatLoopFixedGroupLastIterationInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'P':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginGreedyLoopNoBacktrackInst::Print
                ((BeginGreedyLoopNoBacktrackInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'Q':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      RepeatGreedyLoopNoBacktrackInst::Print
                ((RepeatGreedyLoopNoBacktrackInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'R':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompCharInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'S':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompCharInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompCharInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'T':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompSetInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'U':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompSetInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'V':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'W':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'X':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'Y':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'Z':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompCharBoundedInst::Print((ChompCharBoundedInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '[':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompSetBoundedInst::Print((ChompSetBoundedInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '\\':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      ChompSetBoundedGroupLastCharInst::Print
                ((ChompSetBoundedGroupLastCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case ']':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      TryInst::Print((TryInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '^':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      TryIfCharInst::Print((TryIfCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '_':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      TryMatchCharInst::Print((TryMatchCharInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case '`':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      TryIfSetInst::Print((TryIfSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'a':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      TryMatchSetInst::Print((TryMatchSetInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'b':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      BeginAssertionInst::Print((BeginAssertionInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    case 'c':
      LVar3 = InstPointerToLabel(this,instPointer);
      pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program);
      ppcVar5 = Memory::WriteBarrierPtr::operator_cast_to_char16_t__
                          ((WriteBarrierPtr *)&(pPVar4->rep).insts.litbuf);
      EndAssertionInst::Print((EndAssertionInst *)instPointer,w,LVar3,*ppcVar5);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x15f1,"(false)","false");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    DebugWriter::PrintEOL(w,L"groups:");
    DebugWriter::Indent(w);
    for (local_35c = 0;
        pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program),
        (int)local_35c < (int)(uint)pPVar4->numGroups; local_35c = local_35c + 1) {
      DebugWriter::Print(w,L"%d: ",(ulong)local_35c);
      ppGVar7 = Memory::WriteBarrierPtr::operator_cast_to_GroupInfo__
                          ((WriteBarrierPtr *)&this->groupInfos);
      GroupInfo::Print(*ppGVar7 + (int)local_35c,w,input);
      DebugWriter::EOL(w);
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"loops:");
    DebugWriter::Indent(w);
    for (local_360 = 0;
        pPVar4 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->(&this->program),
        (int)local_360 < pPVar4->numLoops; local_360 = local_360 + 1) {
      DebugWriter::Print(w,L"%d: ",(ulong)local_360);
      ppLVar8 = Memory::WriteBarrierPtr::operator_cast_to_LoopInfo__
                          ((WriteBarrierPtr *)&this->loopInfos);
      LoopInfo::Print(*ppLVar8 + (int)local_360,w);
      DebugWriter::EOL(w);
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"contStack: (top to bottom)");
    DebugWriter::Indent(w);
    ContStack::Print(contStack,w,input);
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"assertionStack: (top to bottom)");
    DebugWriter::Indent(w);
    AssertionStack::Print(assertionStack,w,this);
    DebugWriter::Unindent(w);
  }
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  DebugWriter::Flush(w);
  return;
}

Assistant:

void Matcher::Print(DebugWriter* w, const Char* const input, const CharCount inputLength, CharCount inputOffset, const uint8* instPointer, ContStack &contStack, AssertionStack &assertionStack) const
    {
        w->PrintEOL(_u("Matcher {"));
        w->Indent();
        w->Print(_u("program:      "));
        w->PrintQuotedString(program->source, program->sourceLen);
        w->EOL();
        w->Print(_u("inputPointer: "));
        if (inputLength == 0)
        {
            w->PrintEOL(_u("<empty input>"));
        }
        else if (inputLength > 1024)
        {
            w->PrintEOL(_u("<string too large>"));
        }
        else
        {
            w->PrintEscapedString(input, inputOffset);
            if (inputOffset >= inputLength)
            {
                w->Print(_u("<<<>>>"));
            }
            else
            {
                w->Print(_u("<<<"));
                w->PrintEscapedChar(input[inputOffset]);
                w->Print(_u(">>>"));
                w->PrintEscapedString(input + inputOffset + 1, inputLength - inputOffset - 1);
            }
            w->EOL();
        }
        if (program->tag == Program::ProgramTag::BOIInstructionsTag || program->tag == Program::ProgramTag::InstructionsTag)
        {
            w->Print(_u("instPointer: "));

            const Inst* inst = (const Inst*)instPointer;
            switch (inst->tag)
            {
#define MBase(TagName, ClassName) \
            case Inst::InstTag::TagName: \
            { \
                const ClassName *actualInst = static_cast<const ClassName *>(inst); \
                actualInst->Print(w, InstPointerToLabel(instPointer), program->rep.insts.litbuf); \
                break; \
            }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
            default:
                Assert(false);
                __assume(false);
            }

            w->PrintEOL(_u("groups:"));
            w->Indent();
            for (int i = 0; i < program->numGroups; i++)
            {
                w->Print(_u("%d: "), i);
                groupInfos[i].Print(w, input);
                w->EOL();
            }
            w->Unindent();
            w->PrintEOL(_u("loops:"));
            w->Indent();
            for (int i = 0; i < program->numLoops; i++)
            {
                w->Print(_u("%d: "), i);
                loopInfos[i].Print(w);
                w->EOL();
            }
            w->Unindent();
            w->PrintEOL(_u("contStack: (top to bottom)"));
            w->Indent();
            contStack.Print(w, input);
            w->Unindent();
            w->PrintEOL(_u("assertionStack: (top to bottom)"));
            w->Indent();
            assertionStack.Print(w, this);
            w->Unindent();
        }
        w->Unindent();
        w->PrintEOL(_u("}"));
        w->Flush();
    }